

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzeqnarray.cpp
# Opt level: O2

void __thiscall
TPZEqnArray<std::complex<double>_>::Print
          (TPZEqnArray<std::complex<double>_> *this,char *name,ostream *out)

{
  int iVar1;
  ostream *poVar2;
  int *piVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  
  if (name != (char *)0x0) {
    poVar2 = std::operator<<(out,name);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  for (uVar4 = 0; (long)uVar4 < (long)this->fNumEq; uVar4 = uVar4 + 1) {
    if (uVar4 == this->fNumEq - 1) {
      iVar1 = (int)(this->fEqValues).super_TPZManVector<std::complex<double>,_1000>.
                   super_TPZVec<std::complex<double>_>.fNElements;
      piVar3 = (this->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>.fStore;
    }
    else {
      piVar3 = (this->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>.fStore;
      iVar1 = piVar3[uVar4 + 1];
    }
    for (lVar5 = (long)piVar3[uVar4]; lVar5 < iVar1; lVar5 = lVar5 + 1) {
      poVar2 = std::operator<<(out,"col = ");
      poVar2 = (ostream *)
               std::ostream::operator<<
                         (poVar2,(this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.
                                 fStore[lVar5]);
      std::operator<<(poVar2,"   ");
    }
    std::endl<char,std::char_traits<char>>(out);
    lVar5 = (long)(this->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>.fStore[uVar4];
    lVar6 = lVar5 << 4;
    for (; lVar5 < iVar1; lVar5 = lVar5 + 1) {
      poVar2 = std::operator<<(out,(complex *)
                                   (((this->fEqValues).
                                     super_TPZManVector<std::complex<double>,_1000>.
                                     super_TPZVec<std::complex<double>_>.fStore)->_M_value + lVar6))
      ;
      std::operator<<(poVar2,"  ");
      lVar6 = lVar6 + 0x10;
    }
    std::endl<char,std::char_traits<char>>(out);
    std::endl<char,std::char_traits<char>>(out);
  }
  return;
}

Assistant:

void TPZEqnArray<TVar>::Print(const char *name, std::ostream& out)
{
	if(name) out << name << endl;
	int i,j;
	for(i=0;i<fNumEq;i++){
		int aux_limit;
		
		if(i==fNumEq-1){
			aux_limit=fEqValues.NElements();
		}else aux_limit=fEqStart[i+1];
		for(j=fEqStart[i]; j<aux_limit ; j++) {
			out << "col = " << fIndex[j] << "   ";
		}
		out << endl;
		for(j=fEqStart[i]; j<aux_limit ; j++) {
			out << fEqValues[j] << "  ";
		}
		out << endl;
		out << endl;
	}
}